

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O0

Var Js::DataView::EntrySetInt32(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  DataView *this_00;
  JavascriptLibrary *this_01;
  RecyclableObject *pRVar7;
  DataView *dataView;
  int32 value;
  BOOL isLittleEndian;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x1ed,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x1f0,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  dataView._4_4_ = 0;
  dataView._0_4_ = 0;
  if (((uint)scriptContext & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ec21,(PCWSTR)0x0);
  }
  if (((uint)scriptContext & 0xffffff) == 1) {
    JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ec20,L"offset");
  }
  pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar2 = VarIs<Js::DataView>(pvVar6);
  if (bVar2) {
    if (2 < ((uint)scriptContext & 0xffffff)) {
      pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,2);
      BVar3 = Js::JavascriptOperators::IsUndefined(pvVar6);
      if (BVar3 == 0) {
        pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,2);
        dataView._0_4_ = JavascriptConversion::ToInt32(pvVar6,pSVar4);
      }
      if (3 < ((uint)scriptContext & 0xffffff)) {
        pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,3);
        dataView._4_4_ = JavascriptConversion::ToBoolean(pvVar6,pSVar4);
      }
    }
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
    this_00 = VarTo<Js::DataView>(pvVar6);
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
    SetValue<int>(this_00,pvVar6,(int32)dataView,L"DataView.prototype.SetInt32",dataView._4_4_);
    this_01 = ScriptContext::GetLibrary(pSVar4);
    pRVar7 = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
    return pRVar7;
  }
  JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ec21,(PCWSTR)0x0);
}

Assistant:

Var DataView::EntrySetInt32(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        BOOL isLittleEndian = FALSE;
        int32 value = 0;
        switch (args.Info.Count)
        {
        case 0:
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDataView);
            break;
        case 1:
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DataView_NeedArgument, _u("offset"));
            break;
        default:
            if (!VarIs<DataView>(args[0]))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDataView);
                break;
            }
            if (args.Info.Count > 2)
            {
                if (!JavascriptOperators::IsUndefined(args[2]))
                {
                    value = JavascriptConversion::ToInt32(args[2], scriptContext);
                }
                if (args.Info.Count > 3)
                {
                    isLittleEndian = JavascriptConversion::ToBoolean(args[3], scriptContext);
                }
            }
            break;
        }

        DataView* dataView = VarTo<DataView>(args[0]);
        dataView->SetValue<int32>(args[1], value, _u("DataView.prototype.SetInt32"), isLittleEndian);
        return scriptContext->GetLibrary()->GetUndefined();
    }